

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_test.cpp
# Opt level: O0

void __thiscall
ContextTest_StringFormatWithEmptyContext_Test::~ContextTest_StringFormatWithEmptyContext_Test
          (ContextTest_StringFormatWithEmptyContext_Test *this)

{
  ContextTest_StringFormatWithEmptyContext_Test *this_local;
  
  ~ContextTest_StringFormatWithEmptyContext_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ContextTest, StringFormatWithEmptyContext) {
  CcsDomain ccs;
  std::istringstream input("b c : @constrain d.e");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs.build();
  CcsContext ctx = root.constrain("c").builder().build().constrain("b");
  std::ostringstream os;
  os << ctx;
  EXPECT_EQ("c > b/d.e", os.str());
}